

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::AddKel
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  _ComplexT _Var1;
  long lVar2;
  long lVar3;
  int64_t row;
  complex<float> *pcVar4;
  long lVar5;
  complex<float> *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  lVar2 = source->fNElements;
  lVar9 = 0;
  lVar7 = 0;
  if (0 < lVar2) {
    lVar7 = lVar2;
  }
  for (; lVar9 != lVar7; lVar9 = lVar9 + 1) {
    lVar3 = destination->fStore[lVar9];
    row = source->fStore[lVar9];
    for (lVar8 = lVar9; lVar2 != lVar8; lVar8 = lVar8 + 1) {
      lVar10 = destination->fStore[lVar8];
      lVar5 = -(lVar3 - lVar10);
      lVar11 = lVar3 - lVar10;
      if (lVar11 != 0 && lVar10 <= lVar3) {
        lVar10 = lVar3;
        lVar5 = lVar11;
      }
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(elmat,row,source->fStore[lVar8]);
      pcVar4 = (this->fElem).fStore[lVar10];
      _Var1 = pcVar4[lVar5]._M_value;
      pcVar4[lVar5]._M_value =
           CONCAT44((float)(_Var1 >> 0x20) + (float)(pcVar6->_M_value >> 0x20),
                    (float)_Var1 + (float)pcVar6->_M_value);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}